

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Production.cpp
# Opt level: O2

void __thiscall SGParser::Generator::Production::~Production(Production *this)

{
  uint *puVar1;
  
  puVar1 = this->pRight;
  if ((puVar1 != (uint *)0x0) && (*puVar1 = *puVar1 - 1, *puVar1 == 0)) {
    operator_delete__(puVar1);
  }
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_SGParser::Generator::Production::ConflictAction>,_std::_Select1st<std::pair<const_unsigned_int,_SGParser::Generator::Production::ConflictAction>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SGParser::Generator::Production::ConflictAction>_>_>
  ::~_Rb_tree(&(this->ConflictActions)._M_t);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&(this->LeftChain).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
  ::~_Rb_tree(&(this->ReduceOverrides)._M_t);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

Production::~Production() {
    // Delete RHS
    if (pRight)
        if (!(--pRight[0u]))
            delete[] pRight;
}